

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpuinfo.cpp
# Opt level: O0

void __thiscall asmjit::CpuInfo::detect(CpuInfo *this)

{
  long lVar1;
  void *in_RDI;
  long res;
  CpuInfo *in_stack_00000338;
  undefined4 local_4;
  
  memset(in_RDI,0,0x88);
  x86DetectCpuInfo(in_stack_00000338);
  lVar1 = sysconf(0x54);
  if (lVar1 < 1) {
    local_4 = 1;
  }
  else {
    local_4 = (undefined4)lVar1;
  }
  *(undefined4 *)((long)in_RDI + 0x14) = local_4;
  return;
}

Assistant:

ASMJIT_FAVOR_SIZE void CpuInfo::detect() noexcept {
  reset();

#if ASMJIT_ARCH_ARM32 || ASMJIT_ARCH_ARM64
  armDetectCpuInfo(this);
#endif // ASMJIT_ARCH_ARM32 || ASMJIT_ARCH_ARM64

#if ASMJIT_ARCH_X86 || ASMJIT_ARCH_X64
  x86DetectCpuInfo(this);
#endif // ASMJIT_ARCH_X86 || ASMJIT_ARCH_X64

  _hwThreadsCount = cpuDetectHWThreadsCount();
}